

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# updaterevision.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char lastlog [128];
  char vertag [128];
  char lasthash [128];
  undefined8 uStack_1b0;
  char local_1a8 [127];
  char acStack_129 [128];
  char acStack_a9 [2];
  undefined1 auStack_a7 [127];
  
  acStack_129[1] = '\0';
  local_1a8[0] = '\0';
  if (argc != 2) {
    uStack_1b0 = 0x101456;
    main_cold_1();
    return 1;
  }
  uStack_1b0 = 0x1012c2;
  pFVar3 = popen("git describe --tags && git log -1 --format=%ai*%H","r");
  if (pFVar3 == (FILE *)0x0) {
    bVar1 = true;
  }
  else {
    uStack_1b0 = 0x1012e6;
    pcVar4 = fgets(acStack_129 + 1,0x80,pFVar3);
    bVar1 = true;
    if (pcVar4 == acStack_129 + 1) {
      uStack_1b0 = 0x101301;
      pcVar4 = fgets(local_1a8,0x80,pFVar3);
      if (pcVar4 == local_1a8) {
        if (acStack_129[1] != '\0') {
          uStack_1b0 = 0x10131d;
          sVar5 = strlen(acStack_129 + 1);
          if (acStack_129[sVar5] == '\n') {
            acStack_129[sVar5] = '\0';
          }
        }
        if (local_1a8[0] != '\0') {
          uStack_1b0 = 0x101337;
          sVar5 = strlen(local_1a8);
          if (local_1a8[sVar5 - 1] == '\n') {
            local_1a8[sVar5 - 1] = '\0';
          }
        }
        bVar1 = false;
      }
    }
    uStack_1b0 = 0x10134d;
    pclose(pFVar3);
  }
  if (bVar1) {
LAB_00101374:
    pcVar4 = (char *)0x0;
  }
  else {
    uStack_1b0 = 0x101364;
    pcVar4 = strchr(local_1a8,0x2a);
    if (pcVar4 == (char *)0x0) goto LAB_00101374;
    *pcVar4 = '\0';
    pcVar4 = pcVar4 + 1;
  }
  if (pcVar4 == (char *)0x0) {
    uStack_1b0 = 0x101478;
    main_cold_2();
    pcVar4 = (char *)CONCAT71(auStack_a7._0_7_,acStack_a9[1]);
  }
  uStack_1b0 = 0x101390;
  pFVar3 = fopen(argv[1],"r");
  if (pFVar3 != (FILE *)0x0) {
    if (bVar1) {
      uStack_1b0 = 0x1013a9;
      fclose(pFVar3);
      return 0;
    }
    uStack_1b0 = 0x1013c8;
    pcVar6 = fgets(acStack_a9 + 1,0x80,pFVar3);
    if (pcVar6 == acStack_a9 + 1) {
      if (acStack_a9[1] != '\0') {
        uStack_1b0 = 0x1013ee;
        sVar5 = strlen(acStack_a9 + 1);
        if (acStack_a9[sVar5] == '\n') {
          acStack_a9[sVar5] = '\0';
        }
      }
      uStack_1b0 = 0x101410;
      iVar2 = strcmp(pcVar4,auStack_a7 + 2);
      uStack_1b0 = 0x10141a;
      fclose(pFVar3);
      if (iVar2 == 0) {
        pcVar4 = argv[1];
        pcVar6 = "%s is up to date at commit %s.\n";
        goto LAB_001014ca;
      }
    }
    else {
      uStack_1b0 = 0x1013d5;
      fclose(pFVar3);
    }
  }
  uStack_1b0 = 0x101432;
  pFVar3 = fopen(argv[1],"w");
  if (pFVar3 == (FILE *)0x0) {
    return 1;
  }
  uStack_1b0 = 0x1014aa;
  fprintf(pFVar3,
          "// %s\n//\n// This file was automatically generated by the\n// updaterevision tool. Do not edit by hand.\n\n#define GIT_DESCRIPTION \"%s\"\n#define GIT_HASH \"%s\"\n#define GIT_TIME \"%s\"\n"
          ,pcVar4,acStack_129 + 1,pcVar4,local_1a8);
  uStack_1b0 = 0x1014b2;
  fclose(pFVar3);
  pcVar4 = argv[1];
  pcVar6 = "%s updated to commit %s.\n";
LAB_001014ca:
  uStack_1b0 = 0x1014d1;
  fprintf(_stderr,pcVar6,pcVar4,acStack_129 + 1);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	char vertag[128], lastlog[128], lasthash[128], *hash = NULL;
	FILE *stream = NULL;
	int gotrev = 0, needupdate = 1;

	vertag[0] = '\0';
	lastlog[0] = '\0';

	if (argc != 2)
	{
		fprintf(stderr, "Usage: %s <path to gitinfo.h>\n", argv[0]);
		return 1;
	}

	// Use git describe --tags to get a version string. If we are sitting directly
	// on a tag, it returns that tag. Otherwise it returns <most recent tag>-<number of
	// commits since the tag>-<short hash>.
	// Use git log to get the time of the latest commit in ISO 8601 format and its full hash.
	stream = popen("git describe --tags && git log -1 --format=%ai*%H", "r");

	if (NULL != stream)
	{
		if (fgets(vertag, sizeof vertag, stream) == vertag &&
			fgets(lastlog, sizeof lastlog, stream) == lastlog)
		{
			stripnl(vertag);
			stripnl(lastlog);
			gotrev = 1;
		}

		pclose(stream);
	}

	if (gotrev)
	{
		hash = strchr(lastlog, '*');
		if (hash != NULL)
		{
			*hash = '\0';
			hash++;
		}
	}
	if (hash == NULL)
	{
		fprintf(stderr, "Failed to get commit info: %s\n", strerror(errno));
		strcpy(vertag, "<unknown version>");
		lastlog[0] = '\0';
		lastlog[1] = '0';
		lastlog[2] = '\0';
		hash = lastlog + 1;
	}

	stream = fopen (argv[1], "r");
	if (stream != NULL)
	{
		if (!gotrev)
		{ // If we didn't get a revision but the file does exist, leave it alone.
			fclose (stream);
			return 0;
		}
		// Read the revision that's in this file already. If it's the same as
		// what we've got, then we don't need to modify it and can avoid rebuilding
		// dependant files.
		if (fgets(lasthash, sizeof lasthash, stream) == lasthash)
		{
			stripnl(lasthash);
			if (strcmp(hash, lasthash + 3) == 0)
			{
				needupdate = 0;
			}
		}
		fclose (stream);
	}

	if (needupdate)
	{
		stream = fopen (argv[1], "w");
		if (stream == NULL)
		{
			return 1;
		}
		fprintf(stream,
"// %s\n"
"//\n"
"// This file was automatically generated by the\n"
"// updaterevision tool. Do not edit by hand.\n"
"\n"
"#define GIT_DESCRIPTION \"%s\"\n"
"#define GIT_HASH \"%s\"\n"
"#define GIT_TIME \"%s\"\n",
			hash, vertag, hash, lastlog);
		fclose(stream);
		fprintf(stderr, "%s updated to commit %s.\n", argv[1], vertag);
	}
	else
	{
		fprintf (stderr, "%s is up to date at commit %s.\n", argv[1], vertag);
	}

	return 0;
}